

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

Sprite * __thiscall olc::Sprite::Duplicate(Sprite *this,vi2d *vPos,vi2d *vSize)

{
  Pixel p;
  Sprite *this_00;
  int y;
  int y_00;
  int x;
  int x_00;
  
  this_00 = (Sprite *)operator_new(0x28);
  Sprite(this_00,vSize->x,vSize->y);
  for (y_00 = 0; y_00 < vSize->y; y_00 = y_00 + 1) {
    for (x_00 = 0; x_00 < vSize->x; x_00 = x_00 + 1) {
      p = GetPixel(this,vPos->x + x_00,vPos->y + y_00);
      SetPixel(this_00,x_00,y_00,p);
    }
  }
  return this_00;
}

Assistant:

olc::Sprite* Sprite::Duplicate(const olc::vi2d& vPos, const olc::vi2d& vSize)
	{
		olc::Sprite* spr = new olc::Sprite(vSize.x, vSize.y);
		for (int y = 0; y < vSize.y; y++)
			for (int x = 0; x < vSize.x; x++)
				spr->SetPixel(x, y, GetPixel(vPos.x + x, vPos.y + y));
		return spr;
	}